

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deviceinfo.h
# Opt level: O0

bool __thiscall rcdiscover::DeviceInfo::operator<(DeviceInfo *this,DeviceInfo *info)

{
  bool bVar1;
  tuple<const_unsigned_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  unsigned_long *in_stack_ffffffffffffffd8;
  
  std::tie<unsigned_long_const,std::__cxx11::string_const>
            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  std::tie<unsigned_long_const,std::__cxx11::string_const>
            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  bVar1 = std::operator<((tuple<const_unsigned_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                          *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  return bVar1;
}

Assistant:

bool operator < (const DeviceInfo &info) const
    { return std::tie(mac, iface_name) < std::tie(info.mac, info.iface_name); }